

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void list_genocided(char defquery,boolean ask)

{
  nh_menuitem *pnVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  permonst *pm;
  permonst *pm_00;
  menulist menu;
  char buf [256];
  
  lVar3 = 0x2ff93e;
  uVar9 = 0;
  uVar10 = 0;
  for (lVar7 = 2; lVar7 != 0x4bb; lVar7 = lVar7 + 3) {
    uVar10 = uVar10 + (((&mvitals[0].born)[lVar7] >> 1 & 1) != 0);
    if (((&mvitals[0].born)[lVar7] & 3) != 0) {
      uVar9 = uVar9 + ((*(byte *)(lVar3 + 1) & 0x10) == 0);
    }
    lVar3 = lVar3 + 0x40;
  }
  if (uVar10 != 0 || uVar9 != 0) {
    if (ask != '\0') {
      pcVar4 = "Do you want a list of species genocided?";
      if (uVar9 != 0) {
        pcVar4 = "Do you want a list of species genocided or extinct?";
      }
      defquery = yn_function(pcVar4,"ynq",defquery);
    }
    if (defquery == 'y') {
      init_menulist(&menu);
      pm_00 = mons;
      lVar7 = 0;
      for (lVar3 = 2; lVar3 != 0x4bb; lVar3 = lVar3 + 3) {
        if (((&mvitals[0].born)[lVar3] & 2) == 0) {
          if ((((&mvitals[0].born)[lVar3] & 1) != 0) && (pm = pm_00, (pm_00->geno & 0x1000) == 0)) {
LAB_00192c93:
            pcVar4 = mons_mname(pm);
            pcVar4 = makeplural(pcVar4);
            strcpy(buf,pcVar4);
            goto LAB_00192cad;
          }
        }
        else {
          pm = mons + lVar7;
          if ((lVar3 == 0x362) || ((pm_00->geno & 0x1000) == 0)) goto LAB_00192c93;
          pcVar4 = "the ";
          if ((pm_00->mflags2 & 0x80000) == 0) {
            pcVar4 = "";
          }
          pcVar5 = mons_mname(pm_00);
          sprintf(buf,"%s%s",pcVar4,pcVar5);
LAB_00192cad:
          if (((&mvitals[0].born)[lVar3] & 2) == 0) {
            sVar6 = strlen(buf);
            builtin_strncpy(buf + sVar6," (extinct)",0xb);
          }
          lVar8 = (long)menu.size;
          if (menu.size <= menu.icount) {
            menu.size = menu.size * 2;
            menu.items = (nh_menuitem *)realloc(menu.items,lVar8 * 0x218);
          }
          pnVar1 = menu.items + menu.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,buf);
          menu.icount = menu.icount + 1;
        }
        lVar7 = lVar7 + 1;
        pm_00 = pm_00 + 1;
      }
      if ((0 < (int)uVar9) && (bVar2 = aprilfoolsday(), bVar2 != '\0')) {
        lVar3 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar3 * 0x218);
        }
        menu.items[menu.icount].id = 0;
        menu.items[menu.icount].role = MI_TEXT;
        menu.items[menu.icount].accel = '\0';
        menu.items[menu.icount].group_accel = '\0';
        menu.items[menu.icount].selected = '\0';
        builtin_strncpy(menu.items[menu.icount].caption,"ammonites (extin",0x10);
        builtin_strncpy(menu.items[menu.icount].caption + 0x10,"ct)",4);
        menu.icount = menu.icount + 1;
        uVar9 = uVar9 + 1;
      }
      lVar3 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar3 * 0x218);
      }
      lVar3 = (long)menu.icount;
      menu.items[lVar3].accel = '\0';
      menu.items[lVar3].group_accel = '\0';
      menu.items[lVar3].selected = '\0';
      menu.items[lVar3].id = 0;
      menu.items[lVar3].role = MI_TEXT;
      menu.items[lVar3].caption[0] = '\0';
      menu.icount = menu.icount + 1;
      sprintf(buf,"%d species genocided.",(ulong)uVar10);
      if (uVar10 != 0) {
        lVar3 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar3 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        menu.icount = menu.icount + 1;
      }
      sprintf(buf,"%d species extinct.",(ulong)uVar9);
      if (uVar9 == 0) {
        pcVar4 = "Genocided species:";
      }
      else {
        lVar3 = (long)menu.size;
        if (menu.size <= menu.icount) {
          menu.size = menu.size * 2;
          menu.items = (nh_menuitem *)realloc(menu.items,lVar3 * 0x218);
        }
        pnVar1 = menu.items + menu.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        menu.icount = menu.icount + 1;
        pcVar4 = "Genocided or extinct species:";
      }
      display_menu(menu.items,menu.icount,pcVar4,0,(int *)0x0);
      free(menu.items);
    }
    else if (defquery == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
  }
  return;
}

Assistant:

void list_genocided(char defquery, boolean ask)
{
    int i;
    int ngenocided, nextincted;
    char c, *query, *title;
    char buf[BUFSZ];
    struct menulist menu;

    ngenocided = nextincted = 0;
    for (i = LOW_PM; i < NUMMONS; ++i) {
	if (mvitals[i].mvflags & G_GENOD)
	    ngenocided++;
	if ((mvitals[i].mvflags & G_GONE) && !(mons[i].geno & G_UNIQ))
	    nextincted++;
    }

    /* genocided species list */
    if (ngenocided != 0 || nextincted != 0) {
	query = nextincted ? "Do you want a list of species genocided or extinct?" :
	                     "Do you want a list of species genocided?";
	c = ask ? yn_function(query, ynqchars, defquery) : defquery;
	if (c == 'q') done_stopprint++;
	if (c == 'y') {
	    init_menulist(&menu);
	    for (i = LOW_PM; i < NUMMONS; i++)
		if ((mvitals[i].mvflags & G_GENOD) ||
		    ((mvitals[i].mvflags & G_EXTINCT) && !(mons[i].geno & G_UNIQ))) {
		    if ((mons[i].geno & G_UNIQ) && i != PM_HIGH_PRIEST)
			sprintf(buf, "%s%s",
				!type_is_pname(&mons[i]) ? "" : "the ",
				mons_mname(&mons[i]));
		    else
			strcpy(buf, makeplural(mons_mname(&mons[i])));
		
		    if( !(mvitals[i].mvflags & G_GENOD) )
			strcat(buf, " (extinct)");
		    add_menutext(&menu, buf);
		}

	    if (nextincted > 0 && aprilfoolsday()) {
		add_menutext(&menu, "ammonites (extinct)");
		nextincted++;
	    }

	    add_menutext(&menu, "");
	    sprintf(buf, "%d species genocided.", ngenocided);
	    if (ngenocided)
		add_menutext(&menu, buf);
	    sprintf(buf, "%d species extinct.", nextincted);
	    if (nextincted)
		add_menutext(&menu, buf);

	    title = nextincted ? "Genocided or extinct species:" :
	                         "Genocided species:";
	    display_menu(menu.items, menu.icount, title, PICK_NONE, NULL);
	    free(menu.items);
	}
    }
}